

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

uint ot::commissioner::utils::Decode<unsigned_int>(uint8_t *aBuf,size_t aLength)

{
  ulong local_28;
  size_t i;
  bool condition;
  uint ret;
  size_t aLength_local;
  uint8_t *aBuf_local;
  
  i._4_4_ = 0;
  if (3 < aLength) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      i._4_4_ = i._4_4_ << 8 | (uint)aBuf[local_28];
    }
    return i._4_4_;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned int]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}